

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O1

void __thiscall
vkt::compute::anon_unknown_0::SSBOLocalBarrierTest::initPrograms
          (SSBOLocalBarrierTest *this,SourceCollections *sourceCollections)

{
  int i;
  long lVar1;
  ostream *poVar2;
  ProgramSources *pPVar3;
  int accum_1;
  int iVar4;
  int accum;
  int iVar5;
  ostringstream src;
  long *local_208;
  long local_200;
  long local_1f8 [2];
  string local_1e8;
  uint local_1c8;
  value_type local_1c0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  iVar5 = 1;
  lVar1 = 0;
  do {
    iVar5 = iVar5 * (this->m_localSize).m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  iVar4 = 1;
  lVar1 = 0;
  do {
    iVar4 = iVar4 * (this->m_workSize).m_data[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 3);
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"#version 310 es\n",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"layout (local_size_x = ",0x17);
  poVar2 = (ostream *)std::ostream::operator<<(local_1a0,(this->m_localSize).m_data[0]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", local_size_y = ",0x11);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_localSize).m_data[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", local_size_z = ",0x11);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,(this->m_localSize).m_data[2]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,") in;\n",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"layout(binding = 0) coherent buffer Output {\n",0x2d);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    uint values[",0x10);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar4 * iVar5);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"} sb_out;\n\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"void main (void) {\n",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n",
             0x50);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
             ,0x87);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"    uint globalOffs = localSize*globalNdx;\n",0x2b);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,
             "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
             ,0x99);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"    sb_out.values[globalOffs + localOffs] = globalOffs;\n",0x38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    memoryBarrierBuffer();\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    barrier();\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"    sb_out.values[globalOffs + ((localOffs+1u)%localSize)] += localOffs;\n",
             0x49);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    memoryBarrierBuffer();\n",0x1b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"    barrier();\n",0xf);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar2,"    sb_out.values[globalOffs + ((localOffs+2u)%localSize)] += localOffs;\n",
             0x49);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"}\n",2);
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"comp","");
  pPVar3 = ::vk::ProgramCollection<glu::ProgramSources>::add
                     (&sourceCollections->glslSources,&local_1e8);
  std::__cxx11::stringbuf::str();
  local_1c8 = 5;
  local_1c0._M_dataplus._M_p = (pointer)&local_1c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,local_208,local_200 + (long)local_208);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(pPVar3->sources + local_1c8,&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  if (local_208 != local_1f8) {
    operator_delete(local_208,local_1f8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  return;
}

Assistant:

void SSBOLocalBarrierTest::initPrograms (SourceCollections& sourceCollections) const
{
	const int workGroupSize = multiplyComponents(m_localSize);
	const int workGroupCount = multiplyComponents(m_workSize);
	const int numValues = workGroupSize * workGroupCount;

	std::ostringstream src;
	src << "#version 310 es\n"
		<< "layout (local_size_x = " << m_localSize.x() << ", local_size_y = " << m_localSize.y() << ", local_size_z = " << m_localSize.z() << ") in;\n"
		<< "layout(binding = 0) coherent buffer Output {\n"
		<< "    uint values[" << numValues << "];\n"
		<< "} sb_out;\n\n"
		<< "void main (void) {\n"
		<< "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
		<< "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
		<< "    uint globalOffs = localSize*globalNdx;\n"
		<< "    uint localOffs  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_LocalInvocationID.z + gl_WorkGroupSize.x*gl_LocalInvocationID.y + gl_LocalInvocationID.x;\n"
		<< "\n"
		<< "    sb_out.values[globalOffs + localOffs] = globalOffs;\n"
		<< "    memoryBarrierBuffer();\n"
		<< "    barrier();\n"
		<< "    sb_out.values[globalOffs + ((localOffs+1u)%localSize)] += localOffs;\n"		// += so we read and write
		<< "    memoryBarrierBuffer();\n"
		<< "    barrier();\n"
		<< "    sb_out.values[globalOffs + ((localOffs+2u)%localSize)] += localOffs;\n"
		<< "}\n";

	sourceCollections.glslSources.add("comp") << glu::ComputeSource(src.str());
}